

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngshim.c
# Opt level: O3

void convert_bytes_to_data(png_structp png,png_row_infop row_info,png_bytep data)

{
  png_byte pVar1;
  uint uVar2;
  ulong uVar3;
  
  if (row_info->rowbytes != 0) {
    uVar2 = 4;
    uVar3 = 0;
    do {
      pVar1 = data[uVar3];
      data[uVar3] = data[uVar3 + 2];
      data[uVar3 + 2] = pVar1;
      data[uVar3 + 3] = 0xff;
      uVar3 = (ulong)uVar2;
      uVar2 = uVar2 + 4;
    } while (uVar3 < row_info->rowbytes);
  }
  return;
}

Assistant:

static void
  convert_bytes_to_data( png_structp    png,
                         png_row_infop  row_info,
                         png_bytep      data )
  {
    unsigned int  i;

    FT_UNUSED( png );


    for ( i = 0; i < row_info->rowbytes; i += 4 )
    {
      unsigned char*  base  = &data[i];
      unsigned int    red   = base[0];
      unsigned int    green = base[1];
      unsigned int    blue  = base[2];


      base[0] = (unsigned char)blue;
      base[1] = (unsigned char)green;
      base[2] = (unsigned char)red;
      base[3] = 0xFF;
    }
  }